

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::EncryptionAlgorithm::EncryptionAlgorithm(EncryptionAlgorithm *this)

{
  _AesGcmV1__isset *p_Var1;
  _AesGcmCtrV1__isset *p_Var2;
  
  *(undefined ***)this = &PTR__EncryptionAlgorithm_02484cf8;
  *(undefined ***)&this->AES_GCM_V1 = &PTR__AesGcmV1_02484c28;
  (this->AES_GCM_V1).aad_prefix._M_dataplus._M_p = (pointer)&(this->AES_GCM_V1).aad_prefix.field_2;
  (this->AES_GCM_V1).aad_prefix._M_string_length = 0;
  (this->AES_GCM_V1).aad_prefix.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_V1).aad_file_unique._M_dataplus._M_p =
       (pointer)&(this->AES_GCM_V1).aad_file_unique.field_2;
  (this->AES_GCM_V1).aad_file_unique._M_string_length = 0;
  (this->AES_GCM_V1).aad_file_unique.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_V1).supply_aad_prefix = false;
  p_Var1 = &(this->AES_GCM_V1).__isset;
  *p_Var1 = (_AesGcmV1__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->AES_GCM_CTR_V1 = &PTR__AesGcmCtrV1_02484c90;
  (this->AES_GCM_CTR_V1).aad_prefix._M_dataplus._M_p =
       (pointer)&(this->AES_GCM_CTR_V1).aad_prefix.field_2;
  (this->AES_GCM_CTR_V1).aad_prefix._M_string_length = 0;
  (this->AES_GCM_CTR_V1).aad_prefix.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_CTR_V1).aad_file_unique._M_dataplus._M_p =
       (pointer)&(this->AES_GCM_CTR_V1).aad_file_unique.field_2;
  (this->AES_GCM_CTR_V1).aad_file_unique._M_string_length = 0;
  (this->AES_GCM_CTR_V1).aad_file_unique.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_CTR_V1).supply_aad_prefix = false;
  p_Var2 = &(this->AES_GCM_CTR_V1).__isset;
  *p_Var2 = (_AesGcmCtrV1__isset)((byte)*p_Var2 & 0xf8);
  this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset & 0xfc);
  return;
}

Assistant:

EncryptionAlgorithm::EncryptionAlgorithm() noexcept {
}